

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileRemote::Write(FileRemote *this,char *buffer,size_t size,size_t start)

{
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,"Toolkit",&local_89);
  std::__cxx11::string::string((string *)&local_48,"transport::file::FileRemote",&local_8a);
  std::__cxx11::string::string((string *)&local_68,"Write",&local_8b);
  std::operator+(&local_88,"does not support writing yet ",&(this->super_Transport).m_Name);
  helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_28,&local_48,&local_68,&local_88,-1);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void FileRemote::Write(const char *buffer, size_t size, size_t start)
{
    helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileRemote", "Write",
                                          "does not support writing yet " + m_Name);
}